

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shake256_impl.c
# Opt level: O3

int sprng256_forget(keccak_sponge *sponge)

{
  byte *pbVar1;
  int iVar2;
  uint8_t *state;
  
  if (sponge != (keccak_sponge *)0x0) {
    iVar2 = 1;
    if ((sponge->position < 0x88) && (iVar2 = 2, sponge->flags == 0xbf0420879da9f2d9)) {
      keccakf(sponge);
      sponge->a[6] = 0;
      sponge->a[7] = 0;
      sponge->a[4] = 0;
      sponge->a[5] = 0;
      sponge->a[2] = 0;
      sponge->a[3] = 0;
      sponge->a[0] = 0;
      sponge->a[1] = 0;
      sponge->position = 0x40;
      *(byte *)(sponge->a + 8) = (byte)sponge->a[8] ^ 0x1f;
      pbVar1 = (byte *)((long)sponge->a + 0x87);
      *pbVar1 = *pbVar1 ^ 0x80;
      keccakf(sponge);
      sponge->position = 0;
      iVar2 = 0;
    }
    return iVar2;
  }
  return -1;
}

Assistant:

int sprng256_forget(keccak_sponge* const __restrict sponge) {
  if (sponge == NULL) {
    return SPONGERR_NULL;
  }
  if (sponge->position >= sponge_rate) {
    return SPONGERR_INVARIANT;
  }
  if (sponge->flags != FLAG_SPONGEPRG) {
    return SPONGERR_NOTINIT;
  }

  // Apply the permutation; we then are at position zero.
  keccakf(sponge->a);
  sponge->position = 0;

  // Write sponge_security_strength zero bytes. In this case,
  // this is equivalent to:
  //    memset(sponge->a, 0, 32);
  //    sponge->position = 32;
  _sponge_forget(sponge, sponge_security_strength);

  // Apply padding.
  _shake_pad(sponge);
  if (sponge->position == 0) {
    // The permutation was applied because of the padding rule.
    return 0;
  }

  // The permutation has not yet been applied, so apply it.
  keccakf(sponge->a);
  sponge->position = 0;

  return 0;
}